

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O2

void oonf_rfc5444_send_interface_data
               (oonf_rfc5444_interface *interf,netaddr *dst,void *ptr,size_t len)

{
  char cVar1;
  netaddr_socket sock;
  
  netaddr_socket_init(&sock,dst,interf->protocol->port,((interf->_socket)._if_listener.data)->index)
  ;
  _print_packet_to_buffer
            (LOG_RFC5444_W,&sock,interf,(uint8_t *)ptr,len,"Outgoing RFC5444 packet to",
             "Error while parsing outgoing RFC5444 packet to");
  if (_block_output == true) {
    if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 1) != 0) {
      oonf_log(1,(ulong)_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x397,0,0,
               "Output blocked");
    }
  }
  else {
    cVar1 = netaddr_is_in_subnet(&NETADDR_IPV4_MULTICAST,dst);
    if ((cVar1 == '\0') &&
       (cVar1 = netaddr_is_in_subnet(&NETADDR_IPV6_MULTICAST,dst), cVar1 == '\0')) {
      oonf_packet_send_managed(&interf->_socket,&sock,ptr,len);
      return;
    }
    oonf_packet_send_managed_multicast(&interf->_socket,ptr,len,dst->_type);
  }
  return;
}

Assistant:

void
oonf_rfc5444_send_interface_data(
  struct oonf_rfc5444_interface *interf, const struct netaddr *dst, const void *ptr, size_t len) {
  union netaddr_socket sock;
  struct os_interface_listener *os_interf;

  os_interf = oonf_rfc5444_get_core_if_listener(interf);
  netaddr_socket_init(&sock, dst, interf->protocol->port, os_interf->data->index);

  _print_packet_to_buffer(LOG_RFC5444_W, &sock, interf, ptr, len, "Outgoing RFC5444 packet to",
    "Error while parsing outgoing RFC5444 packet to");

  if (_block_output) {
    OONF_DEBUG(LOG_RFC5444, "Output blocked");
    return;
  }

  if (netaddr_is_in_subnet(&NETADDR_IPV4_MULTICAST, dst) || netaddr_is_in_subnet(&NETADDR_IPV6_MULTICAST, dst)) {
    oonf_packet_send_managed_multicast(&interf->_socket, ptr, len, netaddr_get_address_family(dst));
  }
  else {
    oonf_packet_send_managed(&interf->_socket, &sock, ptr, len);
  }
}